

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::PrintBackgroundCollectionStats(Recycler *this)

{
  MarkData *pMVar1;
  uint local_1c;
  uint repeatCount;
  Recycler *this_local;
  
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"BgSmall : %5s %6s %10s | BgLarge : %5s %6s %10s | BgMark :%9s %4s %s\n",L"Pages",
                L"Count",L"Bytes",L"Pages",L"Count",L"Bytes",L"Count",L"%",L"NonLeafBytes   %");
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  PrintBackgroundCollectionStat(this,(this->collectionStats).backgroundMarkData);
  local_1c = 1;
  while ((local_1c < 2 && ((this->collectionStats).backgroundMarkData[local_1c].markCount != 0))) {
    pMVar1 = (this->collectionStats).backgroundMarkData + local_1c;
    pMVar1->rescanPageCount =
         pMVar1->rescanPageCount -
         (this->collectionStats).backgroundMarkData[local_1c - 1].rescanPageCount;
    (this->collectionStats).backgroundMarkData[local_1c].rescanObjectCount =
         (this->collectionStats).backgroundMarkData[local_1c].rescanObjectCount -
         (this->collectionStats).backgroundMarkData[local_1c - 1].rescanObjectCount;
    (this->collectionStats).backgroundMarkData[local_1c].rescanObjectByteCount =
         (this->collectionStats).backgroundMarkData[local_1c].rescanObjectByteCount -
         (this->collectionStats).backgroundMarkData[local_1c - 1].rescanObjectByteCount;
    (this->collectionStats).backgroundMarkData[local_1c].rescanLargePageCount =
         (this->collectionStats).backgroundMarkData[local_1c].rescanLargePageCount -
         (this->collectionStats).backgroundMarkData[local_1c - 1].rescanLargePageCount;
    (this->collectionStats).backgroundMarkData[local_1c].rescanLargeObjectCount =
         (this->collectionStats).backgroundMarkData[local_1c].rescanLargeObjectCount -
         (this->collectionStats).backgroundMarkData[local_1c - 1].rescanLargeObjectCount;
    (this->collectionStats).backgroundMarkData[local_1c].rescanLargeByteCount =
         (this->collectionStats).backgroundMarkData[local_1c].rescanLargeByteCount -
         (this->collectionStats).backgroundMarkData[local_1c - 1].rescanLargeByteCount;
    PrintBackgroundCollectionStat(this,(this->collectionStats).backgroundMarkData + local_1c);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void
Recycler::PrintBackgroundCollectionStats()
{
#if ENABLE_CONCURRENT_GC
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u("BgSmall : %5s %6s %10s | BgLarge : %5s %6s %10s | BgMark :%9s %4s %s\n"),
        _u("Pages"), _u("Count"), _u("Bytes"), _u("Pages"), _u("Count"), _u("Bytes"), _u("Count"), _u("%"), _u("NonLeafBytes   %"));
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));

    this->PrintBackgroundCollectionStat(collectionStats.backgroundMarkData[0]);
    for (uint repeatCount = 1; repeatCount < RecyclerHeuristic::MaxBackgroundRepeatMarkCount; repeatCount++)
    {
        if (collectionStats.backgroundMarkData[repeatCount].markCount == 0)
        {
            break;
        }
        collectionStats.backgroundMarkData[repeatCount].rescanPageCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanPageCount;
        collectionStats.backgroundMarkData[repeatCount].rescanObjectCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanObjectCount;
        collectionStats.backgroundMarkData[repeatCount].rescanObjectByteCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanObjectByteCount;
        collectionStats.backgroundMarkData[repeatCount].rescanLargePageCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanLargePageCount;
        collectionStats.backgroundMarkData[repeatCount].rescanLargeObjectCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanLargeObjectCount;
        collectionStats.backgroundMarkData[repeatCount].rescanLargeByteCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanLargeByteCount;
        this->PrintBackgroundCollectionStat(collectionStats.backgroundMarkData[repeatCount]);
    }
#endif
}